

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall
Sudoku::createFieldCopy
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *copiedFields)

{
  Field *pFVar1;
  element_type *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer psVar6;
  shared_ptr<Field> *psVar7;
  shared_ptr<Field> *psVar8;
  pointer psVar9;
  undefined1 local_99;
  Sudoku *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  shared_ptr<Field> local_78;
  shared_ptr<Field> new_field;
  _Rb_tree_node_base *local_50;
  
  psVar7 = (this->field_begin_)._M_current;
  if ((this->field_end_)._M_current != psVar7) {
    local_98 = this;
    do {
      pFVar1 = (psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_7c = Field::id(pFVar1);
      local_80 = Field::pos_x(pFVar1);
      local_84 = Field::pos_y(pFVar1);
      local_88 = Field::pos_z(pFVar1);
      local_8c = Field::max_value(pFVar1);
      new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Field,std::allocator<Field>,int,int,int,int,int>
                (&new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Field **)&new_field,(allocator<Field> *)&local_99,&local_7c,&local_80,&local_84,
                 &local_88,&local_8c);
      bVar2 = Field::fixed(pFVar1);
      this_00 = new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar2) {
        iVar3 = Field::value(pFVar1);
        Field::setValue(this_00,iVar3);
        Field::setFixed(new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true)
        ;
      }
      std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::push_back
                (copiedFields,&new_field);
      if (new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  );
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != (local_98->field_end_)._M_current);
    psVar8 = (local_98->field_begin_)._M_current;
    if (psVar7 != psVar8) {
      psVar6 = (copiedFields->
               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pFVar1 = (psVar6->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        Field::dependencies((set<std::shared_ptr<Field>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                             *)&new_field,
                            (psVar8->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        for (p_Var5 = local_50;
            p_Var5 != (_Rb_tree_node_base *)
                      &new_field.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          iVar3 = Field::id(*(Field **)(p_Var5 + 1));
          for (psVar9 = (copiedFields->
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar9 != (copiedFields->
                        super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish; psVar9 = psVar9 + 1) {
            iVar4 = Field::id((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                             );
            if (iVar4 == iVar3) {
              local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
              ;
              if (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                  ->_M_use_count =
                       (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
                }
              }
              Field::addDependency(pFVar1,&local_78);
              if (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78.super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              break;
            }
          }
        }
        std::
        _Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<Field>,_std::shared_ptr<Field>,_std::_Identity<std::shared_ptr<Field>_>,_CompareFields,_std::allocator<std::shared_ptr<Field>_>_>
                     *)&new_field);
        psVar8 = psVar8 + 1;
        psVar6 = psVar6 + 1;
      } while (psVar8 != (local_98->field_end_)._M_current);
    }
  }
  return;
}

Assistant:

void Sudoku::createFieldCopy(std::vector<std::shared_ptr<Field>> &copiedFields)
{
  // create new copy of fields
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++)
  {
    Field &field = **iter;
    // create new field with same properties as field
    std::shared_ptr<Field> new_field = std::make_shared<Field>(field.id(), field.pos_x(), field.pos_y(), field.pos_z(),
      field.max_value());

    // copy fixed state
    if(field.fixed())
    {
      new_field->setValue(field.value());
      new_field->setFixed(true);
    }

    copiedFields.push_back(new_field);
  }

  // create copy of dependencies
  FieldVector::iterator iter_new = copiedFields.begin();
  for(FieldVector::iterator iter = field_begin_; iter != field_end_; iter++, iter_new++)
  {
    Field &field = **iter;
    Field &new_field = **iter_new;
    // loop over all dependencies
    for(auto &dependency: field.dependencies())
    {
      int id = dependency->id();

      // find field with that id in copiedFields
      for(FieldVector::iterator iter_copy = copiedFields.begin(); iter_copy != copiedFields.end(); iter_copy++)
      {
        if((*iter_copy)->id() == id)
        {
          new_field.addDependency((*iter_copy));
          break;
        }
      }
    }
  }
}